

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::EndArray(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *this,SizeType elementCount)

{
  char *pcVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *values;
  
  values = internal::Stack<rapidjson::CrtAllocator>::
           Pop<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&this->stack_,(ulong)elementCount);
  pcVar1 = (this->stack_).stackTop_;
  if ((ulong)((long)pcVar1 - (long)(this->stack_).stack_) < 0x10) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/internal/stack.h"
                  ,0x91,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericValue<rapidjson::UTF8<>>]"
                 );
  }
  if (this->allocator_ != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(pcVar1 + -0x10),values,elementCount,this->allocator_);
    return true;
  }
  __assert_fail("allocator_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                ,0x948,
                "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool EndArray(SizeType elementCount) {
        ValueType* elements = stack_.template Pop<ValueType>(elementCount);
        stack_.template Top<ValueType>()->SetArrayRaw(elements, elementCount, GetAllocator());
        return true;
    }